

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::copyAppend
          (QGenericArrayOps<OrderedScreen> *this,OrderedScreen *b,OrderedScreen *e)

{
  OrderedScreen *pOVar1;
  undefined8 uVar2;
  Data *pDVar3;
  Data *pDVar4;
  Data *pDVar5;
  qreal qVar6;
  qreal qVar7;
  drmModePropertyPtr p_Var8;
  drmModePropertyBlobPtr p_Var9;
  QKmsPlane *pQVar10;
  QSize QVar11;
  OrderedScreen *pOVar12;
  Representation RVar13;
  int iVar14;
  bool bVar15;
  undefined7 uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  undefined4 uVar20;
  undefined3 uVar21;
  bool bVar22;
  bool bVar23;
  undefined3 uVar24;
  long lVar25;
  
  if ((b != e) && (b < e)) {
    pOVar1 = (this->super_QArrayDataPointer<OrderedScreen>).ptr;
    lVar25 = (this->super_QArrayDataPointer<OrderedScreen>).size;
    do {
      pOVar1[lVar25].screen = b->screen;
      RVar13.m_i = (b->vinfo).virtualPos.xp.m_i;
      uVar2 = *(undefined8 *)((long)&(b->vinfo).virtualPos.xp.m_i + 1);
      pOVar1[lVar25].vinfo.virtualIndex = (b->vinfo).virtualIndex;
      pOVar1[lVar25].vinfo.virtualPos.xp = (Representation)RVar13.m_i;
      *(undefined8 *)((long)&pOVar1[lVar25].vinfo.virtualPos.xp.m_i + 1) = uVar2;
      pDVar3 = (b->vinfo).output.name.d.d;
      pOVar1[lVar25].vinfo.output.name.d.d = pDVar3;
      pOVar1[lVar25].vinfo.output.name.d.ptr = (b->vinfo).output.name.d.ptr;
      pOVar1[lVar25].vinfo.output.name.d.size = (b->vinfo).output.name.d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pOVar1[lVar25].vinfo.output.saved_crtc = (b->vinfo).output.saved_crtc;
      uVar17 = (b->vinfo).output.connector_id;
      uVar18 = (b->vinfo).output.crtc_index;
      uVar19 = (b->vinfo).output.crtc_id;
      uVar20 = *(undefined4 *)&(b->vinfo).output.field_0x24;
      qVar6 = (b->vinfo).output.physical_size.wd;
      qVar7 = (b->vinfo).output.physical_size.ht;
      iVar14 = (b->vinfo).output.mode;
      bVar15 = (b->vinfo).output.mode_set;
      uVar16 = *(undefined7 *)&(b->vinfo).output.field_0x41;
      pOVar1[lVar25].vinfo.output.preferred_mode = (b->vinfo).output.preferred_mode;
      pOVar1[lVar25].vinfo.output.mode = iVar14;
      pOVar1[lVar25].vinfo.output.mode_set = bVar15;
      *(undefined7 *)&pOVar1[lVar25].vinfo.output.field_0x41 = uVar16;
      pOVar1[lVar25].vinfo.output.physical_size.wd = qVar6;
      pOVar1[lVar25].vinfo.output.physical_size.ht = qVar7;
      pOVar1[lVar25].vinfo.output.connector_id = uVar17;
      pOVar1[lVar25].vinfo.output.crtc_index = uVar18;
      pOVar1[lVar25].vinfo.output.crtc_id = uVar19;
      *(undefined4 *)&pOVar1[lVar25].vinfo.output.field_0x24 = uVar20;
      pDVar4 = (b->vinfo).output.modes.d.d;
      pOVar1[lVar25].vinfo.output.modes.d.d = pDVar4;
      pOVar1[lVar25].vinfo.output.modes.d.ptr = (b->vinfo).output.modes.d.ptr;
      pOVar1[lVar25].vinfo.output.modes.d.size = (b->vinfo).output.modes.d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar14 = (b->vinfo).output.subpixel;
      uVar20 = *(undefined4 *)&(b->vinfo).output.field_0x6c;
      p_Var8 = (b->vinfo).output.dpms_prop;
      p_Var9 = (b->vinfo).output.edid_blob;
      bVar23 = (b->vinfo).output.wants_forced_plane;
      uVar24 = *(undefined3 *)&(b->vinfo).output.field_0x81;
      uVar19 = (b->vinfo).output.forced_plane_id;
      uVar17 = (b->vinfo).output.forced_plane_id;
      bVar15 = (b->vinfo).output.forced_plane_set;
      uVar21 = *(undefined3 *)&(b->vinfo).output.field_0x89;
      uVar18 = (b->vinfo).output.drm_format;
      bVar22 = (b->vinfo).output.drm_format_requested_by_user;
      pOVar12 = pOVar1 + lVar25;
      *(undefined3 *)&(pOVar12->vinfo).output.field_0x81 =
           *(undefined3 *)&(b->vinfo).output.field_0x81;
      (pOVar12->vinfo).output.forced_plane_id = uVar17;
      (pOVar12->vinfo).output.forced_plane_set = bVar15;
      pOVar12 = pOVar1 + lVar25;
      *(undefined3 *)&(pOVar12->vinfo).output.field_0x89 = uVar21;
      (pOVar12->vinfo).output.drm_format = uVar18;
      (pOVar12->vinfo).output.drm_format_requested_by_user = bVar22;
      pOVar1[lVar25].vinfo.output.edid_blob = p_Var9;
      pOVar12 = pOVar1 + lVar25;
      (pOVar12->vinfo).output.wants_forced_plane = bVar23;
      *(undefined3 *)&(pOVar12->vinfo).output.field_0x81 = uVar24;
      (pOVar12->vinfo).output.forced_plane_id = uVar19;
      pOVar1[lVar25].vinfo.output.subpixel = iVar14;
      *(undefined4 *)&pOVar1[lVar25].vinfo.output.field_0x6c = uVar20;
      pOVar1[lVar25].vinfo.output.dpms_prop = p_Var8;
      pDVar3 = (b->vinfo).output.clone_source.d.d;
      pOVar1[lVar25].vinfo.output.clone_source.d.d = pDVar3;
      pOVar1[lVar25].vinfo.output.clone_source.d.ptr = (b->vinfo).output.clone_source.d.ptr;
      pOVar1[lVar25].vinfo.output.clone_source.d.size = (b->vinfo).output.clone_source.d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar5 = (b->vinfo).output.available_planes.d.d;
      pOVar1[lVar25].vinfo.output.available_planes.d.d = pDVar5;
      pOVar1[lVar25].vinfo.output.available_planes.d.ptr = (b->vinfo).output.available_planes.d.ptr;
      pOVar1[lVar25].vinfo.output.available_planes.d.size =
           (b->vinfo).output.available_planes.d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar10 = (b->vinfo).output.eglfs_plane;
      QVar11 = (b->vinfo).output.size;
      uVar17 = (b->vinfo).output.modeIdPropertyId;
      uVar18 = (b->vinfo).output.activePropertyId;
      uVar19 = (b->vinfo).output.mode_blob_id;
      pOVar1[lVar25].vinfo.output.crtcIdPropertyId = (b->vinfo).output.crtcIdPropertyId;
      pOVar1[lVar25].vinfo.output.modeIdPropertyId = uVar17;
      pOVar1[lVar25].vinfo.output.activePropertyId = uVar18;
      pOVar1[lVar25].vinfo.output.mode_blob_id = uVar19;
      pOVar1[lVar25].vinfo.output.eglfs_plane = pQVar10;
      pOVar1[lVar25].vinfo.output.size = QVar11;
      b = b + 1;
      lVar25 = (this->super_QArrayDataPointer<OrderedScreen>).size + 1;
      (this->super_QArrayDataPointer<OrderedScreen>).size = lVar25;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }